

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlopt-optimizer.cpp
# Opt level: O3

result * baryonyx::itm::nlopt_optimize(result *__return_storage_ptr__,context *ctx,problem *pb)

{
  notice<>(ctx,"- auto-tune parameters (nlopt) starts\n");
  error<>(ctx,"  Baryonyx does not have nlopt. Toggle to manual parameters optimization.\n");
  manual_optimize(__return_storage_ptr__,ctx,pb);
  return __return_storage_ptr__;
}

Assistant:

result
nlopt_optimize(const context& ctx, const problem& pb)
{
    notice(ctx, "- auto-tune parameters (nlopt) starts\n");

#ifdef BARYONYX_HAVE_NLOPT
    return ::optimize(ctx, pb);
#else
    error(ctx,
          "  Baryonyx does not have nlopt. Toggle to manual parameters "
          "optimization.\n");

    return manual_optimize(ctx, pb);
#endif
}